

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uamqp_messaging.c
# Opt level: O0

int readApplicationPropertiesFromuAMQPMessage
              (IOTHUB_MESSAGE_HANDLE iothub_message_handle,MESSAGE_HANDLE uamqp_message)

{
  MAP_RESULT MVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  char *key_value;
  char *key_name;
  AMQP_VALUE map_key_value;
  AMQP_VALUE map_key_name;
  LOGGER_LOG p_Stack_60;
  uint32_t i;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  MAP_HANDLE iothub_message_properties_map;
  AMQP_VALUE pAStack_30;
  uint32_t property_count;
  AMQP_VALUE uamqp_app_properties_ipdv;
  AMQP_VALUE uamqp_app_properties;
  MESSAGE_HANDLE pMStack_18;
  int result;
  MESSAGE_HANDLE uamqp_message_local;
  IOTHUB_MESSAGE_HANDLE iothub_message_handle_local;
  
  uamqp_app_properties_ipdv = (AMQP_VALUE)0x0;
  pAStack_30 = (AMQP_VALUE)0x0;
  iothub_message_properties_map._4_4_ = 0;
  pMStack_18 = uamqp_message;
  uamqp_message_local = (MESSAGE_HANDLE)iothub_message_handle;
  l = (LOGGER_LOG)IoTHubMessage_Properties(iothub_message_handle);
  if ((MAP_HANDLE)l == (MAP_HANDLE)0x0) {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
             ,"readApplicationPropertiesFromuAMQPMessage",0x426,1,
             "Failed to get property map from IoTHub message.");
    }
    uamqp_app_properties._4_4_ = 0x427;
  }
  else {
    uamqp_app_properties._4_4_ =
         message_get_application_properties(pMStack_18,&uamqp_app_properties_ipdv);
    if (uamqp_app_properties._4_4_ == 0) {
      if (uamqp_app_properties_ipdv == (AMQP_VALUE)0x0) {
        uamqp_app_properties._4_4_ = 0;
      }
      else {
        pAStack_30 = amqpvalue_get_inplace_described_value(uamqp_app_properties_ipdv);
        if (pAStack_30 == (AMQP_VALUE)0x0) {
          l_3 = xlogging_get_log_function();
          if (l_3 != (LOGGER_LOG)0x0) {
            (*l_3)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                   ,"readApplicationPropertiesFromuAMQPMessage",0x438,1,
                   "Failed getting the map of uAMQP message application properties (return code %d)."
                   ,uamqp_app_properties._4_4_);
          }
          uamqp_app_properties._4_4_ = 0x439;
        }
        else {
          uamqp_app_properties._4_4_ =
               amqpvalue_get_map_pair_count
                         (pAStack_30,(uint32_t *)((long)&iothub_message_properties_map + 4));
          if (uamqp_app_properties._4_4_ == 0) {
            uamqp_app_properties._4_4_ = 0;
            for (map_key_name._4_4_ = 0;
                uamqp_app_properties._4_4_ == 0 &&
                map_key_name._4_4_ < iothub_message_properties_map._4_4_;
                map_key_name._4_4_ = map_key_name._4_4_ + 1) {
              map_key_value = (AMQP_VALUE)0x0;
              key_name = (char *)0x0;
              uamqp_app_properties._4_4_ =
                   amqpvalue_get_map_key_value_pair
                             (pAStack_30,map_key_name._4_4_,&map_key_value,(AMQP_VALUE *)&key_name);
              if (uamqp_app_properties._4_4_ == 0) {
                uamqp_app_properties._4_4_ = amqpvalue_get_string(map_key_value,&key_value);
                if (uamqp_app_properties._4_4_ == 0) {
                  uamqp_app_properties._4_4_ =
                       amqpvalue_get_string((AMQP_VALUE)key_name,(char **)&l_4);
                  if (uamqp_app_properties._4_4_ == 0) {
                    MVar1 = Map_AddOrUpdate((MAP_HANDLE)l,key_value,(char *)l_4);
                    if (MVar1 != MAP_OK) {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                                  ,"readApplicationPropertiesFromuAMQPMessage",0x45e,1,
                                  "Failed to add/update IoTHub message property map.");
                      }
                      uamqp_app_properties._4_4_ = 0x45f;
                    }
                  }
                  else {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                                ,"readApplicationPropertiesFromuAMQPMessage",0x459,1,
                                "Failed parsing the uAMQP property value (return code %d).",
                                uamqp_app_properties._4_4_);
                    }
                    uamqp_app_properties._4_4_ = 0x45a;
                  }
                }
                else {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                              ,"readApplicationPropertiesFromuAMQPMessage",0x454,1,
                              "Failed parsing the uAMQP property name (return code %d).",
                              uamqp_app_properties._4_4_);
                  }
                  uamqp_app_properties._4_4_ = 0x455;
                }
                amqpvalue_destroy(map_key_value);
                amqpvalue_destroy((AMQP_VALUE)key_name);
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                            ,"readApplicationPropertiesFromuAMQPMessage",0x44c,1,
                            "Failed reading the key/value pair from the uAMQP property map (return code %d)."
                            ,uamqp_app_properties._4_4_);
                }
                uamqp_app_properties._4_4_ = 0x44d;
              }
            }
          }
          else {
            p_Stack_60 = xlogging_get_log_function();
            if (p_Stack_60 != (LOGGER_LOG)0x0) {
              (*p_Stack_60)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                            ,"readApplicationPropertiesFromuAMQPMessage",0x43d,1,
                            "Failed reading the number of values in the uAMQP property map (return code %d)."
                            ,uamqp_app_properties._4_4_);
            }
            uamqp_app_properties._4_4_ = 0x43e;
          }
        }
        amqpvalue_destroy(uamqp_app_properties_ipdv);
      }
    }
    else {
      l_2 = xlogging_get_log_function();
      if (l_2 != (LOGGER_LOG)0x0) {
        (*l_2)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
               ,"readApplicationPropertiesFromuAMQPMessage",0x42b,1,
               "Failed reading the incoming uAMQP message properties (return code %d).",
               uamqp_app_properties._4_4_);
      }
      uamqp_app_properties._4_4_ = 0x42c;
    }
  }
  return uamqp_app_properties._4_4_;
}

Assistant:

static int readApplicationPropertiesFromuAMQPMessage(IOTHUB_MESSAGE_HANDLE iothub_message_handle, MESSAGE_HANDLE uamqp_message)
{
    int result;
    AMQP_VALUE uamqp_app_properties = NULL;
    AMQP_VALUE uamqp_app_properties_ipdv = NULL;
    uint32_t property_count = 0;
    MAP_HANDLE iothub_message_properties_map;

    if ((iothub_message_properties_map = IoTHubMessage_Properties(iothub_message_handle)) == NULL)
    {
        LogError("Failed to get property map from IoTHub message.");
        result = MU_FAILURE;
    }
    else if ((result = message_get_application_properties(uamqp_message, &uamqp_app_properties)) != 0)
    {
        LogError("Failed reading the incoming uAMQP message properties (return code %d).", result);
        result = MU_FAILURE;
    }
    else
    {
        if (uamqp_app_properties == NULL)
        {
            result = 0;
        }
        else
        {
            if ((uamqp_app_properties_ipdv = amqpvalue_get_inplace_described_value(uamqp_app_properties)) == NULL)
            {
                LogError("Failed getting the map of uAMQP message application properties (return code %d).", result);
                result = MU_FAILURE;
            }
            else if ((result = amqpvalue_get_map_pair_count(uamqp_app_properties_ipdv, &property_count)) != 0)
            {
                LogError("Failed reading the number of values in the uAMQP property map (return code %d).", result);
                result = MU_FAILURE;
            }
            else
            {
                uint32_t i;
                for (i = 0; result == RESULT_OK && i < property_count; i++)
                {
                    AMQP_VALUE map_key_name = NULL;
                    AMQP_VALUE map_key_value = NULL;
                    const char *key_name;
                    const char* key_value;

                    if ((result = amqpvalue_get_map_key_value_pair(uamqp_app_properties_ipdv, i, &map_key_name, &map_key_value)) != 0)
                    {
                        LogError("Failed reading the key/value pair from the uAMQP property map (return code %d).", result);
                        result = MU_FAILURE;
                    }

                    else
                    {
                        if ((result = amqpvalue_get_string(map_key_name, &key_name)) != 0)
                        {
                            LogError("Failed parsing the uAMQP property name (return code %d).", result);
                            result = MU_FAILURE;
                        }
                        else if ((result = amqpvalue_get_string(map_key_value, &key_value)) != 0)
                        {
                            LogError("Failed parsing the uAMQP property value (return code %d).", result);
                            result = MU_FAILURE;
                        }
                        else if (Map_AddOrUpdate(iothub_message_properties_map, key_name, key_value) != MAP_OK)
                        {
                            LogError("Failed to add/update IoTHub message property map.");
                            result = MU_FAILURE;
                        }

                        amqpvalue_destroy(map_key_name);
                        amqpvalue_destroy(map_key_value);
                    }
                }
            }

            amqpvalue_destroy(uamqp_app_properties);
        }
    }

    return result;
}